

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

uint32_t kratos::num_size_decrease(Var *var)

{
  Var *this;
  VarType VVar1;
  uint32_t uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  size_type sVar4;
  size_type sVar5;
  size_type diff;
  Var *parent;
  VarSlice *slice;
  Var *var_local;
  
  VVar1 = Var::type(var);
  if (VVar1 == Slice) {
    this = (Var *)var[1].super_IRNode._vptr_IRNode;
    pvVar3 = Var::size(this);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
    pvVar3 = Var::size(var);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
    var_local._4_4_ = (int)sVar4 - (int)sVar5;
    VVar1 = Var::type(this);
    if (VVar1 == Slice) {
      uVar2 = num_size_decrease(this);
      var_local._4_4_ = var_local._4_4_ + uVar2;
    }
  }
  else {
    var_local._4_4_ = 0;
  }
  return var_local._4_4_;
}

Assistant:

uint32_t num_size_decrease(Var *var) {
    if (var->type() == VarType::Slice) {
        auto *slice = reinterpret_cast<VarSlice *>(var);
        auto *parent = slice->parent_var;
        auto diff = parent->size().size() - slice->size().size();
        if (parent->type() == VarType::Slice) {
            return diff + num_size_decrease(reinterpret_cast<VarSlice *>(parent));
        } else {
            // base case 1
            return diff;
        }
    }
    // base case 0
    return 0;
}